

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
__thiscall wabt::MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>(wabt *this,Location *args)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  Location local_48;
  
  puVar4 = (undefined8 *)operator_new(0xc0);
  puVar4[1] = 0;
  puVar4[2] = 0;
  *puVar4 = &PTR__Expr_0155b510;
  sVar1 = (args->filename).size_;
  sVar2 = (args->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args->field_1 + 8);
  puVar4[3] = (args->filename).data_;
  puVar4[4] = sVar1;
  puVar4[5] = sVar2;
  puVar4[6] = uVar3;
  *(undefined4 *)(puVar4 + 7) = 0x21;
  *puVar4 = &PTR__ReturnCallIndirectExpr_0155bf48;
  *(undefined1 *)(puVar4 + 8) = 0;
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  Var::Var((Var *)(puVar4 + 9),0xffffffff,&local_48);
  puVar4[0x16] = 0;
  puVar4[0x17] = 0;
  puVar4[0x14] = 0;
  puVar4[0x15] = 0;
  puVar4[0x12] = 0;
  puVar4[0x13] = 0;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}